

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O2

void __thiscall
trun::TestFunc::ExecuteDependencies
          (TestFunc *this,Ref *dynlib,CBPrePostHook *cbPreHook,CBPrePostHook *cbPostHook)

{
  pointer psVar1;
  element_type *dynlib_00;
  pointer psVar2;
  CBPrePostHook local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  psVar1 = (this->dependencies).
           super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->dependencies).
                super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    dynlib_00 = (psVar2->super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (dynlib_00->state == Idle) {
      std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 &dynlib->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>);
      Execute((TestFunc *)&stack0xffffffffffffffc0,(Ref *)dynlib_00,&local_50,cbPreHook);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
  }
  return;
}

Assistant:

void TestFunc::ExecuteDependencies(IDynLibrary::Ref dynlib, const CBPrePostHook &cbPreHook, const CBPrePostHook &cbPostHook) {
    for (auto &func : dependencies) {
        if (!func->IsIdle()) {
            continue;
        }
        func->Execute(dynlib, cbPreHook, cbPostHook);
    }
}